

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

uint32 google::ParseCommandLineFlagsInternal
                 (int *argc,char ***argv,bool remove_flags,bool do_report)

{
  char cVar1;
  char **ppcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  CommandLineFlag *this;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  mapped_type *pmVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint uVar13;
  uint uVar14;
  Mutex *pMVar15;
  uint32 local_224;
  allocator local_211;
  Mutex *local_210;
  undefined4 local_208;
  undefined4 local_204;
  string key;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string error_message;
  key_type local_178;
  CommandLineFlagParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_204 = (undefined4)CONCAT71(in_register_00000009,do_report);
  local_208 = (undefined4)CONCAT71(in_register_00000011,remove_flags);
  local_210 = (Mutex *)argc;
  SetArgv(*argc,*argv);
  parser.registry_ = anon_unknown_1::FlagRegistry::GlobalRegistry();
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar15 = &(parser.registry_)->lock_;
  parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parser.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  gflags_mutex_namespace::Mutex::Lock(pMVar15);
  anon_unknown_1::CommandLineFlagParser::ProcessFlagfileLocked
            (&local_70,&parser,fLS::FLAGS_flagfile_abi_cxx11_,SET_FLAGS_VALUE);
  std::__cxx11::string::~string((string *)&local_70);
  uVar14 = 1;
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            (&local_90,&parser,fLS::FLAGS_fromenv_abi_cxx11_,SET_FLAGS_VALUE,true);
  std::__cxx11::string::~string((string *)&local_90);
  anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
            (&local_b0,&parser,fLS::FLAGS_tryfromenv_abi_cxx11_,SET_FLAGS_VALUE,false);
  std::__cxx11::string::~string((string *)&local_b0);
  gflags_mutex_namespace::Mutex::Unlock(pMVar15);
  local_224 = *(uint32 *)local_210;
  gflags_mutex_namespace::Mutex::Lock(&(parser.registry_)->lock_);
LAB_0019247a:
  do {
    pMVar15 = local_210;
    if ((int)local_224 <= (int)uVar14) {
LAB_001926cd:
      gflags_mutex_namespace::Mutex::Unlock(&(parser.registry_)->lock_);
      if ((char)local_208 != '\0') {
        (*argv)[(long)(int)local_224 + -1] = **argv;
        *argv = *argv + (long)(int)local_224 + -1;
        *(uint32 *)local_210 = (*(uint32 *)local_210 - local_224) + 1;
        local_224 = 1;
      }
      if ((char)local_204 != '\0') {
        HandleCommandLineHelpFlags();
      }
      local_210 = &(parser.registry_)->lock_;
      gflags_mutex_namespace::Mutex::Lock(local_210);
      for (p_Var11 = ((parser.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var11 !=
          &((parser.registry_)->flags_)._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
        bVar4 = anon_unknown_1::CommandLineFlag::Validate
                          ((CommandLineFlag *)p_Var11[1]._M_parent,
                           ((CommandLineFlag *)p_Var11[1]._M_parent)->current_);
        if (!bVar4) {
          std::__cxx11::string::string
                    ((string *)&key,*(char **)p_Var11[1]._M_parent,(allocator *)&error_message);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&parser.error_flags_,&key);
          sVar3 = pmVar12->_M_string_length;
          std::__cxx11::string::~string((string *)&key);
          if (sVar3 == 0) {
            std::__cxx11::string::string((string *)&local_1d8,"ERROR: ",(allocator *)&local_d0);
            std::operator+(&local_1b8,&local_1d8,"--");
            std::operator+(&error_message,&local_1b8,*(char **)p_Var11[1]._M_parent);
            std::operator+(&key,&error_message,
                           " must be set on the commandline (default value fails validation)\n");
            std::__cxx11::string::string
                      ((string *)&local_178,*(char **)p_Var11[1]._M_parent,(allocator *)&local_f0);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&parser.error_flags_,&local_178);
            std::__cxx11::string::operator=((string *)pmVar12,(string *)&key);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&key);
            std::__cxx11::string::~string((string *)&error_message);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1d8);
          }
        }
      }
      gflags_mutex_namespace::Mutex::Unlock(local_210);
      bVar4 = anon_unknown_1::CommandLineFlagParser::ReportErrors(&parser);
      if (bVar4) {
        uVar6 = (*(code *)gflags_exitfunc)(1);
        return uVar6;
      }
      anon_unknown_1::CommandLineFlagParser::~CommandLineFlagParser(&parser);
      return local_224;
    }
    ppcVar2 = *argv;
    pcVar7 = ppcVar2[(int)uVar14];
    if ((*pcVar7 == '-') && (cVar1 = pcVar7[1], cVar1 != '\0')) {
      pcVar8 = pcVar7 + 1;
      if (cVar1 == '-') {
        pcVar8 = pcVar7 + 2;
      }
      if (pcVar7[(ulong)(cVar1 == '-') + 1] == '\0') {
        local_224 = uVar14 + 1;
        goto LAB_001926cd;
      }
      key._M_dataplus._M_p = (pointer)&key.field_2;
      key._M_string_length = 0;
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      error_message._M_string_length = 0;
      key.field_2._M_local_buf[0] = '\0';
      error_message.field_2._M_local_buf[0] = '\0';
      this = anon_unknown_1::FlagRegistry::SplitArgumentLocked
                       (parser.registry_,pcVar8,&key,&value,&error_message);
      if (this == (CommandLineFlag *)0x0) {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&parser.undefined_names_,&key);
        std::__cxx11::string::assign((char *)pmVar12);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&parser.error_flags_,&key);
        std::__cxx11::string::_M_assign((string *)pmVar12);
      }
      else {
        pcVar7 = value;
        if (value == (char *)0x0) {
          pcVar7 = anon_unknown_1::CommandLineFlag::type_name(this);
          iVar5 = strcmp(pcVar7,"bool");
          if (iVar5 == 0) {
            __assert_fail("strcmp(flag->type_name(), \"bool\") != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                          ,0x434,
                          "uint32 google::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                         );
          }
          uVar13 = uVar14 + 1;
          if ((int)local_224 <= (int)uVar13) {
            std::__cxx11::string::string((string *)&local_f0,"ERROR: ",&local_211);
            std::operator+(&local_d0,&local_f0,"flag \'");
            std::operator+(&local_178,&local_d0,(*argv)[(int)uVar14]);
            std::operator+(&local_1d8,&local_178,"\'");
            std::operator+(&local_1b8,&local_1d8," is missing its argument");
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&parser.error_flags_,&key);
            std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_178);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            if ((this->help_ != (char *)0x0) && ('\x01' < *this->help_)) {
              std::__cxx11::string::string
                        ((string *)&local_1d8,"; flag description: ",(allocator *)&local_178);
              std::operator+(&local_1b8,&local_1d8,this->help_);
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&parser.error_flags_,&key);
              std::__cxx11::string::append((string *)pmVar12);
              std::__cxx11::string::~string((string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_1d8);
            }
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&parser.error_flags_,&key);
            std::__cxx11::string::append((char *)pmVar12);
            std::__cxx11::string::~string((string *)&error_message);
            std::__cxx11::string::~string((string *)&key);
            goto LAB_001926cd;
          }
          pcVar7 = (*argv)[(int)uVar13];
          uVar14 = uVar13;
          value = pcVar7;
          if (*pcVar7 == '-') {
            pcVar8 = anon_unknown_1::CommandLineFlag::type_name(this);
            iVar5 = strcmp(pcVar8,"string");
            if (iVar5 == 0) {
              pcVar8 = this->help_;
              pcVar9 = strstr(pcVar8,"true");
              if (pcVar9 == (char *)0x0) {
                pcVar8 = strstr(pcVar8,"false");
                if (pcVar8 == (char *)0x0) goto LAB_0019260a;
              }
              poVar10 = std::operator<<((ostream *)&std::cerr,"Did you really mean to set flag \'");
              poVar10 = std::operator<<(poVar10,this->name_);
              poVar10 = std::operator<<(poVar10,"\' to the value \'");
              poVar10 = std::operator<<(poVar10,pcVar7);
              std::operator<<(poVar10,"\'?");
            }
          }
        }
LAB_0019260a:
        (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                  (&local_50,&parser,this,pcVar7,SET_FLAGS_VALUE);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&error_message);
      std::__cxx11::string::~string((string *)&key);
      uVar14 = uVar14 + 1;
      goto LAB_0019247a;
    }
    memmove(ppcVar2 + (int)uVar14,ppcVar2 + (long)(int)uVar14 + 1,
            (long)(int)(~uVar14 + *(uint32 *)local_210) << 3);
    (*argv)[(long)(int)*(uint32 *)pMVar15 + -1] = pcVar7;
    local_224 = local_224 - 1;
  } while( true );
}

Assistant:

static uint32 ParseCommandLineFlagsInternal(int* argc, char*** argv,
                                            bool remove_flags, bool do_report) {
  SetArgv(*argc, const_cast<const char**>(*argv));    // save it for later

  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  CommandLineFlagParser parser(registry);

  // When we parse the commandline flags, we'll handle --flagfile,
  // --tryfromenv, etc. as we see them (since flag-evaluation order
  // may be important).  But sometimes apps set FLAGS_tryfromenv/etc.
  // manually before calling ParseCommandLineFlags.  We want to evaluate
  // those too, as if they were the first flags on the commandline.
  registry->Lock();
  parser.ProcessFlagfileLocked(FLAGS_flagfile, SET_FLAGS_VALUE);
  // Last arg here indicates whether flag-not-found is a fatal error or not
  parser.ProcessFromenvLocked(FLAGS_fromenv, SET_FLAGS_VALUE, true);
  parser.ProcessFromenvLocked(FLAGS_tryfromenv, SET_FLAGS_VALUE, false);
  registry->Unlock();

  // Now get the flags specified on the commandline
  const int r = parser.ParseNewCommandLineFlags(argc, argv, remove_flags);

  if (do_report)
    HandleCommandLineHelpFlags();   // may cause us to exit on --help, etc.

  // See if any of the unset flags fail their validation checks
  parser.ValidateAllFlags();

  if (parser.ReportErrors())        // may cause us to exit on illegal flags
    gflags_exitfunc(1);
  return r;
}